

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::Opnd::IsArgumentsObject(Opnd *this)

{
  bool bVar1;
  _func_int **pp_Var2;
  
  if (this->m_kind == OpndKindReg) {
    pp_Var2 = this[1]._vptr_Opnd;
    if (pp_Var2 == (_func_int **)0x0) {
      return false;
    }
  }
  else {
    if (this->m_kind != OpndKindSym) {
      return false;
    }
    pp_Var2 = this[1]._vptr_Opnd;
    if (pp_Var2 == (_func_int **)0x0) {
      return false;
    }
    if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
      return false;
    }
  }
  if (((Instr *)pp_Var2[5] != (Instr *)0x0 & *(byte *)(pp_Var2 + 3)) != 1) {
    return false;
  }
  bVar1 = Instr::HasAnyLoadHeapArgsOpCode((Instr *)pp_Var2[5]);
  return bVar1;
}

Assistant:

bool
Opnd::IsArgumentsObject()
{
    // returns "false" if the sym is not single def (happens when the parent function has formals); the opnd can still be the arguments object.
    // Since we need this information in the inliner where we don't track arguments object sym, going with single def is the best option.
    StackSym * sym = this->GetStackSym();

    return sym && sym->IsSingleDef() && sym->GetInstrDef()->HasAnyLoadHeapArgsOpCode();
}